

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  sqlite3_tokenizer **ppsVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  Fts3HashElem *pFVar6;
  char **p;
  sqlite3_tokenizer_module *psVar7;
  uint uVar8;
  u64 nBytes;
  long lVar9;
  char **pOld;
  long lVar10;
  int n;
  int local_54;
  sqlite3_tokenizer_module *local_50;
  char **local_48;
  sqlite3_tokenizer **local_40;
  char *local_38;
  
  local_54 = 0;
  __s = sqlite3_mprintf("%s");
  iVar2 = 7;
  if (__s != (char *)0x0) {
    local_40 = ppTok;
    sVar3 = strlen(__s);
    pcVar4 = sqlite3Fts3NextToken(__s,&local_54);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = __s;
    }
    lVar9 = (long)local_54;
    pcVar4[lVar9] = '\0';
    sqlite3Fts3Dequote(pcVar4);
    sVar5 = strlen(pcVar4);
    pFVar6 = sqlite3Fts3HashFindElem(pHash,pcVar4,(int)sVar5 + 1);
    if ((pFVar6 == (Fts3HashElem *)0x0) ||
       (psVar7 = (sqlite3_tokenizer_module *)pFVar6->data, psVar7 == (sqlite3_tokenizer_module *)0x0
       )) {
      pcVar4 = sqlite3_mprintf("unknown tokenizer: %s",pcVar4);
      *pzErr = pcVar4;
      iVar2 = 1;
    }
    else {
      local_38 = __s + sVar3;
      pcVar4 = pcVar4 + lVar9 + 1;
      if (pcVar4 < local_38) {
        uVar8 = 8;
        lVar9 = 0;
        pOld = (char **)0x0;
        local_50 = psVar7;
        local_48 = pzErr;
        do {
          pcVar4 = sqlite3Fts3NextToken(pcVar4,&local_54);
          psVar7 = local_50;
          pzErr = local_48;
          p = pOld;
          if (pcVar4 == (char *)0x0) break;
          iVar2 = sqlite3_initialize();
          if (iVar2 != 0) {
LAB_0017cc8b:
            sqlite3_free(__s);
            sqlite3_free(pOld);
            return 7;
          }
          nBytes = 0;
          if (0 < (int)uVar8) {
            nBytes = (u64)uVar8;
          }
          p = (char **)sqlite3Realloc(pOld,nBytes);
          if (p == (char **)0x0) goto LAB_0017cc8b;
          p[lVar9] = pcVar4;
          lVar10 = (long)local_54;
          pcVar4[lVar10] = '\0';
          sqlite3Fts3Dequote(pcVar4);
          pcVar4 = pcVar4 + lVar10 + 1;
          uVar8 = uVar8 + 8;
          lVar9 = lVar9 + 1;
          psVar7 = local_50;
          pzErr = local_48;
          pOld = p;
        } while (pcVar4 < local_38);
      }
      else {
        lVar9 = 0;
        p = (char **)0x0;
      }
      ppsVar1 = local_40;
      iVar2 = (*psVar7->xCreate)((int)lVar9,p,local_40);
      if (iVar2 == 0) {
        (*ppsVar1)->pModule = psVar7;
      }
      else {
        pcVar4 = sqlite3_mprintf("unknown tokenizer");
        *pzErr = pcVar4;
      }
      sqlite3_free(p);
    }
    sqlite3_free(__s);
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    *pzErr = sqlite3_mprintf("unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      int nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      *pzErr = sqlite3_mprintf("unknown tokenizer");
    }else{
      (*ppTok)->pModule = m; 
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}